

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O1

void __thiscall
btSoftBodyCollisionShape::getAabb
          (btSoftBodyCollisionShape *this,btTransform *t,btVector3 *aabbMin,btVector3 *aabbMax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  btSoftBody *pbVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float afStack_94 [5];
  ulong uStack_80;
  undefined1 local_78 [8];
  float afStack_70 [2];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  pbVar6 = this->m_body;
  fVar16 = pbVar6->m_bounds[0].m_floats[0];
  fVar10 = pbVar6->m_bounds[0].m_floats[1];
  fVar28 = pbVar6->m_bounds[0].m_floats[2];
  fVar25 = (t->m_basis).m_el[0].m_floats[0];
  fVar23 = (t->m_basis).m_el[0].m_floats[1];
  fVar17 = (t->m_basis).m_el[0].m_floats[2];
  fVar12 = (t->m_basis).m_el[2].m_floats[0];
  fVar15 = (t->m_basis).m_el[2].m_floats[1];
  fVar11 = fVar10 * fVar15;
  fVar29 = fVar16 * fVar12;
  fVar30 = fVar29 + fVar11;
  fVar13 = (t->m_basis).m_el[2].m_floats[2];
  fVar8 = fVar28 * fVar13;
  fVar1 = (t->m_basis).m_el[1].m_floats[1];
  fVar9 = fVar10 * fVar23;
  fVar10 = fVar10 * fVar1;
  fVar2 = (t->m_basis).m_el[1].m_floats[0];
  fVar14 = fVar16 * fVar25;
  fVar16 = fVar16 * fVar2;
  fVar3 = (t->m_basis).m_el[1].m_floats[2];
  fVar4 = (t->m_origin).m_floats[2];
  fVar21 = fVar14 + fVar9;
  fVar22 = fVar16 + fVar10;
  fVar27 = fVar28 * fVar17;
  fVar28 = fVar28 * fVar3;
  uVar5 = *(undefined8 *)(t->m_origin).m_floats;
  fVar19 = (float)uVar5;
  fVar20 = (float)((ulong)uVar5 >> 0x20);
  fVar26 = pbVar6->m_bounds[1].m_floats[0];
  fVar24 = pbVar6->m_bounds[1].m_floats[1];
  fVar18 = pbVar6->m_bounds[1].m_floats[2];
  uVar5 = CONCAT44(fVar28 + fVar22 + fVar20,fVar27 + fVar21 + fVar19);
  fVar12 = fVar12 * fVar26;
  fVar25 = fVar26 * fVar25;
  fVar26 = fVar26 * fVar2;
  fVar11 = fVar11 + fVar12;
  fVar9 = fVar9 + fVar25;
  fVar10 = fVar10 + fVar26;
  local_78._4_4_ = fVar28 + fVar10 + fVar20;
  local_78._0_4_ = fVar27 + fVar9 + fVar19;
  unique0x10000038 = fVar8 + fVar11 + fVar4;
  unique0x1000003c = 0;
  fVar15 = fVar15 * fVar24;
  fVar23 = fVar24 * fVar23;
  fVar24 = fVar24 * fVar1;
  fVar12 = fVar12 + fVar15;
  fVar25 = fVar25 + fVar23;
  fVar26 = fVar26 + fVar24;
  local_68._4_4_ = fVar28 + fVar26 + fVar20;
  local_68._0_4_ = fVar27 + fVar25 + fVar19;
  local_68._8_4_ = fVar8 + fVar12 + fVar4;
  local_68._12_4_ = 0;
  fVar15 = fVar15 + fVar29;
  fVar23 = fVar23 + fVar14;
  fVar24 = fVar24 + fVar16;
  local_58._4_4_ = fVar28 + fVar24 + fVar20;
  local_58._0_4_ = fVar27 + fVar23 + fVar19;
  local_58._8_4_ = fVar8 + fVar15 + fVar4;
  local_58._12_4_ = 0;
  fVar13 = fVar13 * fVar18;
  fVar17 = fVar18 * fVar17;
  fVar18 = fVar18 * fVar3;
  local_48._4_4_ = fVar22 + fVar18 + fVar20;
  local_48._0_4_ = fVar21 + fVar17 + fVar19;
  local_48._8_4_ = fVar30 + fVar13 + fVar4;
  local_48._12_4_ = 0;
  local_38._4_4_ = fVar10 + fVar18 + fVar20;
  local_38._0_4_ = fVar9 + fVar17 + fVar19;
  local_38._8_4_ = fVar11 + fVar13 + fVar4;
  local_38._12_4_ = 0;
  local_28._4_4_ = fVar26 + fVar18 + fVar20;
  local_28._0_4_ = fVar25 + fVar17 + fVar19;
  local_28._8_4_ = fVar12 + fVar13 + fVar4;
  local_28._12_4_ = 0;
  local_18._4_4_ = fVar18 + fVar24 + fVar20;
  local_18._0_4_ = fVar17 + fVar23 + fVar19;
  local_18._8_4_ = fVar13 + fVar15 + fVar4;
  local_18._12_4_ = 0;
  uStack_80 = (ulong)(uint)(fVar8 + fVar30 + fVar4);
  *(undefined8 *)aabbMax->m_floats = uVar5;
  *(ulong *)(aabbMax->m_floats + 2) = uStack_80;
  *(undefined8 *)aabbMin->m_floats = uVar5;
  *(ulong *)(aabbMin->m_floats + 2) = uStack_80;
  lVar7 = 0x1c;
  do {
    fVar16 = *(float *)((long)afStack_94 + lVar7);
    if (fVar16 < aabbMin->m_floats[0]) {
      aabbMin->m_floats[0] = fVar16;
    }
    fVar10 = *(float *)((long)afStack_94 + lVar7 + 4);
    if (fVar10 < aabbMin->m_floats[1]) {
      aabbMin->m_floats[1] = fVar10;
    }
    fVar28 = *(float *)((long)afStack_94 + lVar7 + 8);
    if (fVar28 < aabbMin->m_floats[2]) {
      aabbMin->m_floats[2] = fVar28;
    }
    fVar12 = *(float *)((long)afStack_94 + lVar7 + 0xc);
    if (fVar12 < aabbMin->m_floats[3]) {
      aabbMin->m_floats[3] = fVar12;
    }
    if (aabbMax->m_floats[0] <= fVar16 && fVar16 != aabbMax->m_floats[0]) {
      aabbMax->m_floats[0] = fVar16;
    }
    if (aabbMax->m_floats[1] <= fVar10 && fVar10 != aabbMax->m_floats[1]) {
      aabbMax->m_floats[1] = fVar10;
    }
    if (aabbMax->m_floats[2] <= fVar28 && fVar28 != aabbMax->m_floats[2]) {
      aabbMax->m_floats[2] = fVar28;
    }
    if (aabbMax->m_floats[3] <= fVar12 && fVar12 != aabbMax->m_floats[3]) {
      aabbMax->m_floats[3] = fVar12;
    }
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x8c);
  return;
}

Assistant:

virtual void getAabb(const btTransform& t,btVector3& aabbMin,btVector3& aabbMax) const
	{
		/* t is usually identity, except when colliding against btCompoundShape. See Issue 512 */
		const btVector3	mins=m_body->m_bounds[0];
		const btVector3	maxs=m_body->m_bounds[1];
		const btVector3	crns[]={t*btVector3(mins.x(),mins.y(),mins.z()),
			t*btVector3(maxs.x(),mins.y(),mins.z()),
			t*btVector3(maxs.x(),maxs.y(),mins.z()),
			t*btVector3(mins.x(),maxs.y(),mins.z()),
			t*btVector3(mins.x(),mins.y(),maxs.z()),
			t*btVector3(maxs.x(),mins.y(),maxs.z()),
			t*btVector3(maxs.x(),maxs.y(),maxs.z()),
			t*btVector3(mins.x(),maxs.y(),maxs.z())};
		aabbMin=aabbMax=crns[0];
		for(int i=1;i<8;++i)
		{
			aabbMin.setMin(crns[i]);
			aabbMax.setMax(crns[i]);
		}
	}